

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  int slave;
  int iVar1;
  int mode;
  
  puts("SOEM (Simple Open EtherCAT Master)\nEEPROM tool");
  ::mode = 0;
  if (argc < 4) {
    puts("Usage: eepromtool ifname slave OPTION fname|alias");
    puts("ifname = eth0 for example");
    puts("slave = slave number in EtherCAT order 1..n");
    puts("    -i      display EEPROM information");
    puts("    -walias write slave alias");
    puts("    -r      read EEPROM, output binary format");
    puts("    -ri     read EEPROM, output Intel Hex format");
    puts("    -w      write EEPROM, input binary format");
    puts("    -wi     write EEPROM, input Intel Hex format");
  }
  else {
    slave = atoi(argv[2]);
    __s1 = argv[3];
    mode = 0;
    if (((*__s1 == '-') && (__s1[1] == 'i')) && (__s1[2] == '\0')) {
      ::mode = 6;
      mode = 6;
    }
    ::slave = slave;
    if (argc != 4) {
      if (((*__s1 == '-') && (__s1[1] == 'r')) && (__s1[2] == '\0')) {
        ::mode = 1;
        mode = 1;
      }
      iVar1 = strncmp(__s1,"-ri",4);
      if (iVar1 == 0) {
        ::mode = 2;
        mode = 2;
      }
      if (((*__s1 == '-') && (__s1[1] == 'w')) && (__s1[2] == '\0')) {
        ::mode = 3;
        mode = 3;
      }
      iVar1 = strncmp(__s1,"-wi",4);
      if (iVar1 == 0) {
        ::mode = 4;
        mode = 4;
      }
      iVar1 = strncmp(__s1,"-walias",8);
      if (iVar1 == 0) {
        ::mode = 5;
        alias = atoi(argv[4]);
        mode = 5;
      }
    }
    eepromtool(argv[1],slave,mode,argv[4]);
  }
  puts("End program");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   printf("SOEM (Simple Open EtherCAT Master)\nEEPROM tool\n");

   mode = MODE_NONE;
   if (argc > 3)
   {      
      slave = atoi(argv[2]);
      if ((strncmp(argv[3], "-i", sizeof("-i")) == 0))   mode = MODE_INFO;
      if (argc > 4)
      {
         if ((strncmp(argv[3], "-r", sizeof("-r")) == 0))   mode = MODE_READBIN;
         if ((strncmp(argv[3], "-ri", sizeof("-ri")) == 0)) mode = MODE_READINTEL;
         if ((strncmp(argv[3], "-w", sizeof("-w")) == 0))   mode = MODE_WRITEBIN;
         if ((strncmp(argv[3], "-wi", sizeof("-wi")) == 0)) mode = MODE_WRITEINTEL;
         if ((strncmp(argv[3], "-walias", sizeof("-walias")) == 0))
         {
            mode = MODE_WRITEALIAS;
            alias = atoi(argv[4]);
         }
      }
      /* start tool */
      eepromtool(argv[1],slave,mode,argv[4]);
   }
   else
   {
      printf("Usage: eepromtool ifname slave OPTION fname|alias\n");
      printf("ifname = eth0 for example\n");
      printf("slave = slave number in EtherCAT order 1..n\n");
      printf("    -i      display EEPROM information\n");
      printf("    -walias write slave alias\n");
      printf("    -r      read EEPROM, output binary format\n");
      printf("    -ri     read EEPROM, output Intel Hex format\n");
      printf("    -w      write EEPROM, input binary format\n");
      printf("    -wi     write EEPROM, input Intel Hex format\n");
   }   
   
   printf("End program\n");
   
   return (0);
}